

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

ParseStatus ParseVP8XChunks(WebPDemuxer *dmux)

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  ushort uVar6;
  undefined2 uVar7;
  uint32_t uVar8;
  size_t sVar9;
  uint8_t *puVar10;
  Frame *pFVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  ParseStatus PVar15;
  Frame *frame;
  Chunk *pCVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ParseStatus PVar20;
  uint uVar21;
  uint uVar22;
  bool bVar24;
  uint local_34;
  ulong uVar23;
  
  bVar12 = false;
  local_34 = dmux->feature_flags & 2;
  do {
    sVar9 = (dmux->mem).start;
    puVar10 = (dmux->mem).buf;
    iVar13 = *(int *)(puVar10 + sVar9);
    (dmux->mem).start = sVar9 + 4;
    bVar2 = puVar10[sVar9 + 4];
    uVar21 = (uint)puVar10[sVar9 + 6] << 0x10 | (uint)puVar10[sVar9 + 5] << 8 |
             (uint)puVar10[sVar9 + 7] << 0x18 | (uint)bVar2;
    sVar1 = sVar9 + 8;
    (dmux->mem).start = sVar1;
    if (uVar21 < 0xfffffff7) {
      uVar22 = (bVar2 & 1) + uVar21;
      uVar23 = (ulong)uVar22;
      uVar19 = (dmux->mem).riff_end - sVar1;
      if (uVar19 < uVar23) goto LAB_00150bec;
      frame = (Frame *)0x0;
      if (iVar13 < 0x48504c41) {
        if (iVar13 < 0x46495845) {
          if (iVar13 == 0x20385056) goto LAB_00150df5;
          bVar24 = false;
          if (iVar13 == 0x20504d58) {
            iVar17 = 2;
            goto LAB_00150e2c;
          }
LAB_00150e36:
          PVar20 = PARSE_NEED_MORE_DATA;
          if (uVar23 <= (dmux->mem).end - sVar1) {
            if (!bVar24) {
              pCVar16 = (Chunk *)WebPSafeCalloc(1,0x18);
              if (pCVar16 == (Chunk *)0x0) {
                iVar13 = 1;
                PVar20 = PARSE_OK;
                goto LAB_00150bf1;
              }
              (pCVar16->data).offset = sVar9;
              (pCVar16->data).size = (ulong)(uVar21 + 8);
              *dmux->chunks_tail = pCVar16;
              pCVar16->next = (Chunk *)0x0;
              dmux->chunks_tail = &pCVar16->next;
            }
            (dmux->mem).start = (dmux->mem).start + uVar23;
            goto LAB_00150e99;
          }
        }
        else {
          if (iVar13 == 0x46495845) {
            iVar17 = 3;
LAB_00150e2c:
            bVar24 = (dmux->feature_flags >> iVar17 & 1) == 0;
            goto LAB_00150e36;
          }
          bVar24 = false;
          if (iVar13 != 0x464d4e41) goto LAB_00150e36;
          if (!bVar12) {
            bVar12 = false;
            goto LAB_00150bec;
          }
          uVar21 = dmux->feature_flags;
          PVar20 = PARSE_ERROR;
          if ((0xf < uVar19 && 0xf < uVar22) &&
             (PVar20 = PARSE_NEED_MORE_DATA, 0xf < (dmux->mem).end - sVar1)) {
            frame = (Frame *)WebPSafeCalloc(1,0x50);
            PVar20 = (uint)(frame == (Frame *)0x0) * 2;
          }
          bVar12 = true;
          if (PVar20 == PARSE_OK) {
            sVar1 = (dmux->mem).start;
            puVar10 = (dmux->mem).buf;
            bVar2 = puVar10[sVar1];
            bVar3 = puVar10[sVar1 + 1];
            bVar4 = puVar10[sVar1 + 2];
            (dmux->mem).start = sVar1 + 3;
            frame->x_offset = (uint)bVar3 * 0x200 + (uint)bVar2 * 2 | (uint)bVar4 << 0x11;
            bVar2 = puVar10[sVar1 + 3];
            bVar3 = puVar10[sVar1 + 4];
            bVar4 = puVar10[sVar1 + 5];
            (dmux->mem).start = sVar1 + 6;
            frame->y_offset = (uint)bVar3 * 0x200 + (uint)bVar2 * 2 | (uint)bVar4 << 0x11;
            uVar6 = *(ushort *)(puVar10 + sVar1 + 6);
            bVar2 = puVar10[sVar1 + 8];
            (dmux->mem).start = sVar1 + 9;
            uVar14 = (uint)uVar6 + (uint)bVar2 * 0x10000 + 1;
            frame->width = uVar14;
            uVar6 = *(ushort *)(puVar10 + sVar1 + 9);
            bVar2 = puVar10[sVar1 + 0xb];
            (dmux->mem).start = sVar1 + 0xc;
            uVar18 = (uint)uVar6 + (uint)bVar2 * 0x10000 + 1;
            frame->height = uVar18;
            uVar7 = *(undefined2 *)(puVar10 + sVar1 + 0xc);
            uVar5 = puVar10[sVar1 + 0xe];
            (dmux->mem).start = sVar1 + 0xf;
            frame->duration = (uint)CONCAT12(uVar5,uVar7);
            bVar2 = puVar10[sVar1 + 0xf];
            (dmux->mem).start = sVar1 + 0x10;
            frame->dispose_method = bVar2 & WEBP_MUX_DISPOSE_BACKGROUND;
            frame->blend_method = bVar2 >> 1 & WEBP_MUX_NO_BLEND;
            if ((int)((ulong)uVar14 * (ulong)uVar18 >> 0x20) == 0) {
              PVar15 = StoreFrame(dmux->num_frames + 1,uVar22 - 0x10,&dmux->mem,frame);
              PVar20 = PARSE_ERROR;
              if ((PVar15 != PARSE_ERROR) &&
                 (PVar20 = PVar15, (ulong)(uVar22 - 0x10) < (dmux->mem).start - (sVar1 + 0x10))) {
                PVar20 = PARSE_ERROR;
              }
              bVar12 = true;
              if (((PVar20 != PARSE_ERROR) && ((uVar21 & 2) != 0)) && (0 < frame->frame_num)) {
                pFVar11 = *dmux->frames_tail;
                if ((pFVar11 == (Frame *)0x0) || (pFVar11->complete != 0)) {
                  *dmux->frames_tail = frame;
                  frame->next = (Frame *)0x0;
                  dmux->frames_tail = &frame->next;
                  dmux->num_frames = dmux->num_frames + 1;
                  bVar12 = false;
                }
                else {
                  PVar20 = PARSE_ERROR;
                }
              }
              if (bVar12) {
                WebPSafeFree(frame);
              }
            }
            else {
              WebPSafeFree(frame);
              PVar20 = PARSE_ERROR;
            }
            bVar12 = true;
          }
        }
LAB_00150e9c:
        sVar1 = (dmux->mem).start;
        iVar13 = 2;
        if (sVar1 != (dmux->mem).riff_end) {
          if ((dmux->mem).end - sVar1 < 8) {
            PVar20 = PARSE_NEED_MORE_DATA;
          }
          iVar13 = 0;
        }
      }
      else {
        if (0x4d494e40 < iVar13) {
          if (iVar13 != 0x4d494e41) {
            iVar17 = 5;
            if (iVar13 == 0x50434349) goto LAB_00150e2c;
            bVar24 = false;
            if (iVar13 != 0x58385056) goto LAB_00150e36;
            goto LAB_00150bec;
          }
          if (uVar22 < 6) goto LAB_00150bec;
          PVar20 = PARSE_NEED_MORE_DATA;
          if ((dmux->mem).end - sVar1 < uVar23) goto LAB_00150e9c;
          bVar24 = true;
          if (bVar12) goto LAB_00150e36;
          uVar8 = *(uint32_t *)(puVar10 + sVar9 + 8);
          (dmux->mem).start = sVar9 + 0xc;
          dmux->bgcolor = uVar8;
          dmux->loop_count = (uint)*(ushort *)(puVar10 + sVar9 + 0xc);
          (dmux->mem).start = sVar9 + (uVar22 - 6) + 0xe;
          bVar12 = true;
LAB_00150e99:
          PVar20 = PARSE_OK;
          goto LAB_00150e9c;
        }
        if ((iVar13 != 0x48504c41) && (bVar24 = false, iVar13 != 0x4c385056)) goto LAB_00150e36;
LAB_00150df5:
        if (bVar12) goto LAB_00150bec;
        iVar13 = 1;
        PVar20 = PARSE_OK;
        if (local_34 == 0) {
          (dmux->mem).start = sVar9;
          PVar20 = ParseSingleImage(dmux);
          bVar12 = false;
          goto LAB_00150e9c;
        }
      }
    }
    else {
LAB_00150bec:
      iVar13 = 1;
      PVar20 = PARSE_OK;
    }
LAB_00150bf1:
    if (iVar13 != 0) {
      if (iVar13 == 2) {
        return PVar20;
      }
      return PARSE_ERROR;
    }
    if (PVar20 != PARSE_OK) {
      return PVar20;
    }
  } while( true );
}

Assistant:

static ParseStatus ParseVP8XChunks(WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags & ANIMATION_FLAG);
  MemBuffer* const mem = &dmux->mem;
  int anim_chunks = 0;
  ParseStatus status = PARSE_OK;

  do {
    int store_chunk = 1;
    const size_t chunk_start_offset = mem->start;
    const uint32_t fourcc = ReadLE32(mem);
    const uint32_t chunk_size = ReadLE32(mem);
    uint32_t chunk_size_padded;

    if (chunk_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

    chunk_size_padded = chunk_size + (chunk_size & 1);
    if (SizeIsInvalid(mem, chunk_size_padded)) return PARSE_ERROR;

    switch (fourcc) {
      case MKFOURCC('V', 'P', '8', 'X'): {
        return PARSE_ERROR;
      }
      case MKFOURCC('A', 'L', 'P', 'H'):
      case MKFOURCC('V', 'P', '8', ' '):
      case MKFOURCC('V', 'P', '8', 'L'): {
        // check that this isn't an animation (all frames should be in an ANMF).
        if (anim_chunks > 0 || is_animation) return PARSE_ERROR;

        Rewind(mem, CHUNK_HEADER_SIZE);
        status = ParseSingleImage(dmux);
        break;
      }
      case MKFOURCC('A', 'N', 'I', 'M'): {
        if (chunk_size_padded < ANIM_CHUNK_SIZE) return PARSE_ERROR;

        if (MemDataSize(mem) < chunk_size_padded) {
          status = PARSE_NEED_MORE_DATA;
        } else if (anim_chunks == 0) {
          ++anim_chunks;
          dmux->bgcolor = ReadLE32(mem);
          dmux->loop_count = ReadLE16s(mem);
          Skip(mem, chunk_size_padded - ANIM_CHUNK_SIZE);
        } else {
          store_chunk = 0;
          goto Skip;
        }
        break;
      }
      case MKFOURCC('A', 'N', 'M', 'F'): {
        if (anim_chunks == 0) return PARSE_ERROR;  // 'ANIM' precedes frames.
        status = ParseAnimationFrame(dmux, chunk_size_padded);
        break;
      }
      case MKFOURCC('I', 'C', 'C', 'P'): {
        store_chunk = !!(dmux->feature_flags & ICCP_FLAG);
        goto Skip;
      }
      case MKFOURCC('E', 'X', 'I', 'F'): {
        store_chunk = !!(dmux->feature_flags & EXIF_FLAG);
        goto Skip;
      }
      case MKFOURCC('X', 'M', 'P', ' '): {
        store_chunk = !!(dmux->feature_flags & XMP_FLAG);
        goto Skip;
      }
 Skip:
      default: {
        if (chunk_size_padded <= MemDataSize(mem)) {
          if (store_chunk) {
            // Store only the chunk header and unpadded size as only the payload
            // will be returned to the user.
            if (!StoreChunk(dmux, chunk_start_offset,
                            CHUNK_HEADER_SIZE + chunk_size)) {
              return PARSE_ERROR;
            }
          }
          Skip(mem, chunk_size_padded);
        } else {
          status = PARSE_NEED_MORE_DATA;
        }
      }
    }

    if (mem->start == mem->riff_end) {
      break;
    } else if (MemDataSize(mem) < CHUNK_HEADER_SIZE) {
      status = PARSE_NEED_MORE_DATA;
    }
  } while (status == PARSE_OK);

  return status;
}